

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureGatherTests.cpp
# Opt level: O1

int __thiscall
vkt::sr::anon_unknown_0::TextureGatherInstance::init(TextureGatherInstance *this,EVP_PKEY_CTX *ctx)

{
  deInt32 *pdVar1;
  ostringstream *this_00;
  ostringstream *this_01;
  ostringstream *this_02;
  int iVar2;
  deUint32 dVar3;
  Context *this_03;
  uint uVar4;
  VkPhysicalDeviceFeatures *pVVar5;
  VkPhysicalDeviceProperties *pVVar6;
  ulong uVar7;
  NotSupportedError *this_04;
  TestError *pTVar8;
  ulong uVar9;
  long lVar10;
  char *pcVar11;
  uint uVar12;
  ulong uVar13;
  TextureBindingSp textureBinding;
  value_type local_6c8;
  TestLog *local_6b8;
  string local_6b0;
  string local_690;
  string local_670;
  string local_650;
  undefined1 local_630 [8];
  SharedPtrStateBase *local_628;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_620;
  _Alloc_hider local_610;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_600;
  _Alloc_hider local_5f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5e0;
  qpKeyValueTag local_5d0;
  deInt64 local_5c8;
  ios_base local_5b8 [264];
  undefined1 local_4b0 [32];
  _Alloc_hider local_490;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_480;
  _Alloc_hider local_470;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_460;
  qpKeyValueTag local_450;
  deInt64 local_448;
  ios_base local_438 [264];
  undefined1 local_330 [120];
  ios_base local_2b8 [264];
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  this_03 = (this->super_ShaderRenderCaseInstance).super_TestInstance.m_context;
  local_6b8 = this_03->m_testCtx->m_log;
  local_6c8.m_ptr = (TextureBinding *)0x0;
  local_6c8.m_state = (SharedPtrStateBase *)0x0;
  if (((((this->m_baseParams).gatherType & ~GATHERTYPE_OFFSET) == GATHERTYPE_OFFSET_DYNAMIC) ||
      ((this->m_baseParams).offsetSize == OFFSETSIZE_IMPLEMENTATION_MAXIMUM)) &&
     (pVVar5 = Context::getDeviceFeatures(this_03), pVVar5->shaderImageGatherExtended == 0)) {
    this_04 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_04,"Extended set of image gather instructions are not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRenderTextureGatherTests.cpp"
               ,0x493);
    __cxa_throw(this_04,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  if ((this->m_baseParams).offsetSize == OFFSETSIZE_IMPLEMENTATION_MAXIMUM) {
    pVVar6 = Context::getDeviceProperties
                       ((this->super_ShaderRenderCaseInstance).super_TestInstance.m_context);
    iVar2 = (pVVar6->limits).minTexelGatherOffset;
    dVar3 = (pVVar6->limits).maxTexelGatherOffset;
    local_1b0._0_8_ = local_1b0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b0,"ImplementationMinTextureGatherOffset","");
    local_330._0_8_ = local_330 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_330,"Implementation\'s value for minTexelGatherOffset","");
    local_6b0._M_dataplus._M_p = (pointer)&local_6b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_6b0,"");
    tcu::LogNumber<long>::LogNumber
              ((LogNumber<long> *)local_630,(string *)local_1b0,(string *)local_330,&local_6b0,
               QP_KEY_TAG_NONE,(long)iVar2);
    tcu::TestLog::writeInteger
              (local_6b8,(char *)local_630,local_610._M_p,local_5f0._M_p,local_5d0,local_5c8);
    local_690._M_dataplus._M_p = (pointer)&local_690.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_690,"ImplementationMaxTextureGatherOffset","");
    local_650._M_dataplus._M_p = (pointer)&local_650.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_650,"Implementation\'s value for maxTexelGatherOffset","");
    local_670._M_dataplus._M_p = (pointer)&local_670.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_670,"");
    tcu::LogNumber<long>::LogNumber
              ((LogNumber<long> *)local_4b0,&local_690,&local_650,&local_670,QP_KEY_TAG_NONE,
               (long)(int)dVar3);
    tcu::TestLog::writeInteger
              (local_6b8,(char *)local_4b0._0_8_,local_490._M_p,local_470._M_p,local_450,local_448);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_470._M_p != &local_460) {
      operator_delete(local_470._M_p,local_460._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_490._M_p != &local_480) {
      operator_delete(local_490._M_p,local_480._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_4b0._0_8_ != local_4b0 + 0x10) {
      operator_delete((void *)local_4b0._0_8_,local_4b0._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_670._M_dataplus._M_p != &local_670.field_2) {
      operator_delete(local_670._M_dataplus._M_p,local_670.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_650._M_dataplus._M_p != &local_650.field_2) {
      operator_delete(local_650._M_dataplus._M_p,local_650.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_690._M_dataplus._M_p != &local_690.field_2) {
      operator_delete(local_690._M_dataplus._M_p,local_690.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5f0._M_p != &local_5e0) {
      operator_delete(local_5f0._M_p,local_5e0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_610._M_p != &local_600) {
      operator_delete(local_610._M_p,local_600._M_allocated_capacity + 1);
    }
    if (local_630 != (undefined1  [8])&local_620) {
      operator_delete((void *)local_630,local_620._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6b0._M_dataplus._M_p != &local_6b0.field_2) {
      operator_delete(local_6b0._M_dataplus._M_p,local_6b0.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
      operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
    }
    if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
      operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
    }
    if (-8 < iVar2) {
      pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
      local_1b0._0_4_ = 0xfffffff8;
      de::toString<int>((string *)local_4b0,(int *)local_1b0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_630,
                     "minTexelGatherOffset must be at most ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4b0)
      ;
      tcu::TestError::TestError
                (pTVar8,(char *)local_630,"offsetRange[0] <= SPEC_MAX_MIN_OFFSET",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRenderTextureGatherTests.cpp"
                 ,0x49c);
      __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    if ((int)dVar3 < 7) {
      pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
      local_1b0._0_4_ = 7;
      de::toString<int>((string *)local_4b0,(int *)local_1b0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_630,
                     "maxTexelGatherOffset must be at least ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4b0)
      ;
      tcu::TestError::TestError
                (pTVar8,(char *)local_630,"offsetRange[1] >= SPEC_MIN_MAX_OFFSET",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRenderTextureGatherTests.cpp"
                 ,0x49d);
      __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
  }
  (*(this->super_ShaderRenderCaseInstance).super_TestInstance._vptr_TestInstance[9])(local_630,this)
  ;
  if (local_6c8.m_state != local_628) {
    if (local_6c8.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_6c8.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_6c8.m_ptr = (TextureBinding *)0x0;
        (*(local_6c8.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &(local_6c8.m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if ((*pdVar1 == 0) && (local_6c8.m_state != (SharedPtrStateBase *)0x0)) {
        (*(local_6c8.m_state)->_vptr_SharedPtrStateBase[1])();
      }
    }
    local_6c8.m_ptr = (TextureBinding *)local_630;
    local_6c8.m_state = local_628;
    if (local_628 != (SharedPtrStateBase *)0x0) {
      LOCK();
      local_628->strongRefCount = local_628->strongRefCount + 1;
      UNLOCK();
      LOCK();
      local_628->weakRefCount = local_628->weakRefCount + 1;
      UNLOCK();
    }
  }
  if (local_628 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &local_628->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_630 = (undefined1  [8])0x0;
      (*local_628->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &local_628->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_628 != (SharedPtrStateBase *)0x0) {
        (*local_628->_vptr_SharedPtrStateBase[1])();
      }
      local_628 = (SharedPtrStateBase *)0x0;
    }
  }
  uVar7 = 0x600000000;
  if ((this->m_baseParams).textureSwizzle.m_isSome == true) {
    uVar13 = (ulong)(this->m_baseParams).textureSwizzle.m_swizzle.m_data[0];
    uVar9 = 0;
    uVar4 = 0;
    if (uVar13 < 6) {
      uVar4 = *(uint *)(&DAT_00b54838 + uVar13 * 4);
    }
    uVar13 = (ulong)(this->m_baseParams).textureSwizzle.m_swizzle.m_data[1];
    if (uVar13 < 6) {
      uVar9 = (ulong)*(uint *)(&DAT_00b54838 + uVar13 * 4);
    }
    uVar13 = (ulong)(this->m_baseParams).textureSwizzle.m_swizzle.m_data[2];
    uVar12 = 0;
    if (uVar13 < 6) {
      uVar12 = *(uint *)(&DAT_00b54838 + uVar13 * 4);
    }
    switch((this->m_baseParams).textureSwizzle.m_swizzle.m_data[3]) {
    case TEXTURESWIZZLECOMPONENT_R:
      uVar7 = 0x300000000;
      break;
    case TEXTURESWIZZLECOMPONENT_G:
      uVar7 = 0x400000000;
      break;
    case TEXTURESWIZZLECOMPONENT_B:
      uVar7 = 0x500000000;
      break;
    case TEXTURESWIZZLECOMPONENT_A:
      break;
    case TEXTURESWIZZLECOMPONENT_ZERO:
      uVar7 = 0x100000000;
      break;
    case TEXTURESWIZZLECOMPONENT_ONE:
      uVar7 = 0x200000000;
      break;
    default:
      uVar7 = 0;
    }
  }
  else {
    uVar9 = 4;
    uVar4 = 3;
    uVar12 = 5;
  }
  *(int *)((long)local_6c8.m_ptr + 0x40) = (this->m_baseParams).baseLevel;
  *(ulong *)((long)local_6c8.m_ptr + 0x44) = (ulong)uVar4 | uVar9 << 0x20;
  *(ulong *)((long)local_6c8.m_ptr + 0x4c) = uVar12 | uVar7;
  *(char *)&((local_6c8.m_ptr)->m_params).samples = '\x01';
  *(char *)((long)&((local_6c8.m_ptr)->m_params).samples + 1) = '\0';
  *(char *)((long)&((local_6c8.m_ptr)->m_params).samples + 2) = '\0';
  *(char *)((long)&((local_6c8.m_ptr)->m_params).samples + 3) = '\0';
  *(char *)&((local_6c8.m_ptr)->m_params).initialization = '\0';
  *(char *)((long)&((local_6c8.m_ptr)->m_params).initialization + 1) = '\0';
  *(char *)((long)&((local_6c8.m_ptr)->m_params).initialization + 2) = '\0';
  *(char *)((long)&((local_6c8.m_ptr)->m_params).initialization + 3) = '\0';
  std::
  vector<de::SharedPtr<vkt::sr::TextureBinding>,_std::allocator<de::SharedPtr<vkt::sr::TextureBinding>_>_>
  ::push_back(&(this->super_ShaderRenderCaseInstance).m_textures,&local_6c8);
  this_00 = (ostringstream *)(local_330 + 8);
  local_330._0_8_ = local_6b8;
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"Texture base level is ",0x16);
  std::ostream::operator<<(this_00,(this->m_baseParams).baseLevel);
  local_1b0._0_8_ =
       tcu::MessageBuilder::operator<<
                 ((MessageBuilder *)local_330,(EndMessageToken *)&tcu::TestLog::EndMessage);
  this_01 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(this_01);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_01,"s and t wrap modes are ",0x17);
  local_6b0._M_string_length._0_4_ = ::vk::mapWrapMode((this->m_baseParams).wrapS);
  local_6b0._M_dataplus._M_p = (pointer)::vk::getSamplerAddressModeName;
  tcu::Format::Enum<vk::VkSamplerAddressMode,_4UL>::toStream
            ((Enum<vk::VkSamplerAddressMode,_4UL> *)&local_6b0,(ostream *)this_01);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01," and ",5);
  local_6b0._M_string_length._0_4_ = ::vk::mapWrapMode((this->m_baseParams).wrapT);
  local_6b0._M_dataplus._M_p = (pointer)::vk::getSamplerAddressModeName;
  tcu::Format::Enum<vk::VkSamplerAddressMode,_4UL>::toStream
            ((Enum<vk::VkSamplerAddressMode,_4UL> *)&local_6b0,(ostream *)this_01);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,", respectively",0xe);
  local_4b0._0_8_ =
       tcu::MessageBuilder::operator<<
                 ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  this_02 = (ostringstream *)(local_4b0 + 8);
  std::__cxx11::ostringstream::ostringstream(this_02);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_02,"Minification and magnification filter modes are ",0x30);
  local_6b0._M_string_length._0_4_ = ::vk::mapFilterMode((this->m_baseParams).minFilter);
  local_6b0._M_dataplus._M_p = (pointer)::vk::getFilterName;
  tcu::Format::Enum<vk::VkFilter,_4UL>::toStream
            ((Enum<vk::VkFilter,_4UL> *)&local_6b0,(ostream *)this_02);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_02," and ",5);
  local_6b0._M_string_length._0_4_ = ::vk::mapFilterMode((this->m_baseParams).magFilter);
  local_6b0._M_dataplus._M_p = (pointer)::vk::getFilterName;
  tcu::Format::Enum<vk::VkFilter,_4UL>::toStream
            ((Enum<vk::VkFilter,_4UL> *)&local_6b0,(ostream *)this_02);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_02,", respectively ",0xf);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_02,"(note that they should have no effect on gather result)",0x37);
  local_630 = (undefined1  [8])
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_4b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_628);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_628,"Using texture swizzle ",0x16);
  if ((this->m_baseParams).textureSwizzle.m_isSome == true) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_628,"(",1);
    anon_unknown_0::operator<<
              ((ostream *)&local_628,(this->m_baseParams).textureSwizzle.m_swizzle.m_data[0]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_628,", ",2);
    anon_unknown_0::operator<<
              ((ostream *)&local_628,(this->m_baseParams).textureSwizzle.m_swizzle.m_data[1]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_628,", ",2);
    anon_unknown_0::operator<<
              ((ostream *)&local_628,(this->m_baseParams).textureSwizzle.m_swizzle.m_data[2]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_628,", ",2);
    anon_unknown_0::operator<<
              ((ostream *)&local_628,(this->m_baseParams).textureSwizzle.m_swizzle.m_data[3]);
    lVar10 = 1;
    pcVar11 = ")";
  }
  else {
    lVar10 = 0x17;
    pcVar11 = "[default swizzle state]";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_628,pcVar11,lVar10);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_630,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_628);
  std::ios_base::~ios_base(local_5b8);
  std::__cxx11::ostringstream::~ostringstream(this_02);
  std::ios_base::~ios_base(local_438);
  std::__cxx11::ostringstream::~ostringstream(this_01);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_2b8);
  if ((this->m_baseParams).shadowCompareMode != COMPAREMODE_NONE) {
    local_630 = (undefined1  [8])local_6b8;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_628);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_628,"Using texture compare func ",0x1b);
    local_4b0._8_4_ = ::vk::mapCompareMode((this->m_baseParams).shadowCompareMode);
    local_4b0._0_8_ = ::vk::getCompareOpName;
    tcu::Format::Enum<vk::VkCompareOp,_4UL>::toStream
              ((Enum<vk::VkCompareOp,_4UL> *)local_4b0,(ostream *)&local_628);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_630,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_628);
    std::ios_base::~ios_base(local_5b8);
  }
  if (local_6c8.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_6c8.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_6c8.m_ptr = (TextureBinding *)0x0;
      (*(local_6c8.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_6c8.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) && (local_6c8.m_state != (SharedPtrStateBase *)0x0)) {
      uVar4 = (*(local_6c8.m_state)->_vptr_SharedPtrStateBase[1])();
      local_6c8.m_state = (SharedPtrStateBase *)(ulong)uVar4;
    }
  }
  return (int)local_6c8.m_state;
}

Assistant:

void TextureGatherInstance::init (void)
{
	TestLog&						log					= m_context.getTestContext().getLog();
	TextureBindingSp				textureBinding;
	TextureBinding::Parameters		textureParams;

	// Check prerequisites.
	if (requireGpuShader5(m_baseParams.gatherType, m_baseParams.offsetSize))
	{
		const vk::VkPhysicalDeviceFeatures&		deviceFeatures	= m_context.getDeviceFeatures();
		if (!deviceFeatures.shaderImageGatherExtended)
			TCU_THROW(NotSupportedError, "Extended set of image gather instructions are not supported");
	}

	// Log and check implementation offset limits, if appropriate.
	if (m_baseParams.offsetSize == OFFSETSIZE_IMPLEMENTATION_MAXIMUM)
	{
		const IVec2		offsetRange		= getOffsetRange(m_baseParams.offsetSize, m_context.getDeviceProperties().limits);
		log << TestLog::Integer("ImplementationMinTextureGatherOffset", "Implementation's value for minTexelGatherOffset", "", QP_KEY_TAG_NONE, offsetRange[0])
			<< TestLog::Integer("ImplementationMaxTextureGatherOffset", "Implementation's value for maxTexelGatherOffset", "", QP_KEY_TAG_NONE, offsetRange[1]);
		TCU_CHECK_MSG(offsetRange[0] <= SPEC_MAX_MIN_OFFSET, ("minTexelGatherOffset must be at most " + de::toString((int)SPEC_MAX_MIN_OFFSET)).c_str());
		TCU_CHECK_MSG(offsetRange[1] >= SPEC_MIN_MAX_OFFSET, ("maxTexelGatherOffset must be at least " + de::toString((int)SPEC_MIN_MAX_OFFSET)).c_str());
	}

	// Initialize texture.

	textureBinding = createTexture();

	if (m_baseParams.textureSwizzle.isSome())
	{
		const tcu::Vector<TextureSwizzleComponent, 4>&	swizzle		= m_baseParams.textureSwizzle.getSwizzle();

		const vk::VkComponentMapping					components	=
		{
			getTextureSwizzleComponent(swizzle[0]),
			getTextureSwizzleComponent(swizzle[1]),
			getTextureSwizzleComponent(swizzle[2]),
			getTextureSwizzleComponent(swizzle[3])
		};

		textureParams.componentMapping = components;
	}

	if (m_baseParams.baseLevel != 0)
		textureParams.baseMipLevel = m_baseParams.baseLevel;

	textureBinding->setParameters(textureParams);
	m_textures.push_back(textureBinding);

	log << TestLog::Message << "Texture base level is " << m_baseParams.baseLevel << TestLog::EndMessage
		<< TestLog::Message << "s and t wrap modes are "
							<< vk::mapWrapMode(m_baseParams.wrapS) << " and "
							<< vk::mapWrapMode(m_baseParams.wrapT) << ", respectively" << TestLog::EndMessage
		<< TestLog::Message << "Minification and magnification filter modes are "
							<< vk::mapFilterMode(m_baseParams.minFilter) << " and "
							<< vk::mapFilterMode(m_baseParams.magFilter) << ", respectively "
							<< "(note that they should have no effect on gather result)"
							<< TestLog::EndMessage
		<< TestLog::Message << "Using texture swizzle " << m_baseParams.textureSwizzle << TestLog::EndMessage;

	if (m_baseParams.shadowCompareMode != tcu::Sampler::COMPAREMODE_NONE)
		log << TestLog::Message << "Using texture compare func " << vk::mapCompareMode(m_baseParams.shadowCompareMode) << TestLog::EndMessage;
}